

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O1

void Map_MappingCuts(Map_Man_t *p)

{
  Map_Node_t *p_00;
  Map_Node_t *pMVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ProgressBar *p_01;
  Map_CutTable_t *p_02;
  Map_Cut_t **ppMVar8;
  int *piVar9;
  Map_Cut_t *pMVar10;
  Map_Cut_t *pMVar11;
  Map_Cut_t *pMVar12;
  Map_Cut_t *pMVar13;
  uint uVar14;
  long lVar15;
  undefined1 *puVar16;
  ulong uVar17;
  Map_Node_t *pMVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 *puVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  Map_Cut_t *pMVar26;
  Map_Cut_t *pListNew;
  timespec ts;
  Map_Node_t *ppNodes [6];
  Map_Cut_t **local_138;
  uint local_10c;
  uint local_108;
  long local_e8;
  Map_Cut_t **local_e0;
  Map_Cut_t *local_d8;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8 [7];
  ProgressBar *local_80;
  ulong local_78;
  ulong local_70;
  Map_Node_t *local_68 [7];
  
  iVar4 = clock_gettime(3,(timespec *)local_b8);
  if (iVar4 < 0) {
    local_d0 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_b8[1]),8);
    local_d0 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_b8[0] * -1000000;
  }
  if (4 < p->nVarsMax - 2U) {
    __assert_fail("p->nVarsMax > 1 && p->nVarsMax < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                  ,0xb4,"void Map_MappingCuts(Map_Man_t *)");
  }
  if (0 < p->nInputs) {
    lVar15 = 0;
    do {
      Map_MappingCutsInput(p,p->pInputs[lVar15]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < p->nInputs);
  }
  uVar7 = p->vMapObjs->nSize;
  uVar21 = (ulong)uVar7;
  p_01 = Extra_ProgressBarStart(_stdout,uVar7);
  p_02 = (Map_CutTable_t *)malloc(0x38);
  p_02->pBins = (Map_Cut_t **)0x0;
  *(undefined8 *)&p_02->nBins = 0;
  p_02->pCuts = (int *)0x0;
  *(undefined8 *)&p_02->nCuts = 0;
  p_02->pArray = (Map_Cut_t **)0x0;
  p_02->pCuts1 = (Map_Cut_t **)0x0;
  p_02->pCuts2 = (Map_Cut_t **)0x0;
  uVar24 = 9999;
  while( true ) {
    do {
      uVar14 = uVar24 + 1;
      uVar5 = uVar24 & 1;
      uVar24 = uVar14;
    } while (uVar5 != 0);
    if (uVar14 < 9) break;
    iVar4 = 5;
    while (uVar14 % (iVar4 - 2U) != 0) {
      uVar5 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar14 < uVar5) goto LAB_003fcc97;
    }
  }
LAB_003fcc97:
  p_02->nBins = uVar14;
  ppMVar8 = (Map_Cut_t **)malloc((long)(int)uVar14 << 3);
  p_02->pBins = ppMVar8;
  memset(ppMVar8,0,(long)(int)uVar14 << 3);
  piVar9 = (int *)malloc(8000);
  p_02->pCuts = piVar9;
  ppMVar8 = (Map_Cut_t **)malloc(16000);
  p_02->pArray = ppMVar8;
  ppMVar8 = (Map_Cut_t **)malloc(16000);
  p_02->pCuts1 = ppMVar8;
  ppMVar8 = (Map_Cut_t **)malloc(16000);
  p_02->pCuts2 = ppMVar8;
  if (0 < (int)uVar7) {
    lVar15 = 0;
    local_80 = p_01;
    local_78 = uVar21;
    do {
      p_00 = p->vMapObjs->pArray[lVar15];
      iVar4 = Map_NodeIsBuf(p_00);
      if (iVar4 == 0) {
        iVar4 = Map_NodeIsAnd(p_00);
        if (iVar4 != 0) {
          if (p_00->pCuts == (Map_Cut_t *)0x0) {
            pMVar18 = p_00->p1;
            pMVar1 = p_00->p2;
            pMVar11 = *(Map_Cut_t **)(((ulong)pMVar18 & 0xfffffffffffffffe) + 0xa0);
            pMVar12 = *(Map_Cut_t **)(((ulong)pMVar1 & 0xfffffffffffffffe) + 0xa0);
            local_b8[4] = 0;
            local_b8[5] = 0;
            local_b8[2] = 0;
            local_b8[3] = 0;
            local_b8[0] = 0;
            local_b8[1] = 0;
            local_b8[6] = 0;
            local_e0 = p_02->pCuts1;
            lVar20 = 0;
            lVar25 = 0;
            if (pMVar11 != (Map_Cut_t *)0x0) {
              lVar25 = 0;
              do {
                local_e0[lVar25] = pMVar11;
                pMVar11 = pMVar11->pNext;
                lVar25 = lVar25 + 1;
              } while (pMVar11 != (Map_Cut_t *)0x0);
            }
            ppMVar8 = p_02->pCuts2;
            if (pMVar12 != (Map_Cut_t *)0x0) {
              lVar20 = 0;
              do {
                ppMVar8[lVar20] = pMVar12;
                pMVar12 = pMVar12->pNext;
                lVar20 = lVar20 + 1;
              } while (pMVar12 != (Map_Cut_t *)0x0);
            }
            uVar14 = (uint)pMVar18 & 1;
            local_108 = (uint)pMVar1 & 1;
            uVar5 = (uint)lVar25;
            uVar19 = (uint)lVar20;
            uVar24 = uVar5;
            uVar7 = uVar14;
            local_138 = ppMVar8;
            local_10c = uVar19;
            if ((int)uVar19 < (int)uVar5) {
              uVar24 = uVar19;
              uVar7 = local_108;
              local_138 = local_e0;
              local_10c = uVar5;
              local_108 = uVar14;
              local_e0 = ppMVar8;
            }
            Map_CutTableRestart(p_02);
            if ((int)uVar24 < 1) {
              iVar4 = 0;
            }
            else {
              local_c8 = (ulong)local_108;
              local_70 = (ulong)uVar24;
              uVar21 = 0;
              local_e8 = 1;
              iVar4 = 0;
              local_c0 = (ulong)uVar7;
              do {
                lVar20 = 0;
                do {
                  pMVar11 = local_e0[uVar21];
                  pMVar12 = local_138[lVar20];
                  iVar6 = p->nVarsMax;
                  if ((((iVar6 != pMVar11->nLeaves) || (iVar6 != pMVar12->nLeaves)) ||
                      ((pMVar11->ppLeaves[0] == pMVar12->ppLeaves[0] &&
                       (pMVar11->ppLeaves[1] == pMVar12->ppLeaves[1])))) &&
                     ((iVar6 = Map_CutMergeTwo(pMVar11,pMVar12,local_68,iVar6), iVar6 != 0 &&
                      (pMVar10 = Map_CutTableConsider(p,p_02,local_68,iVar6),
                      pMVar10 != (Map_Cut_t *)0x0)))) {
                    pMVar10->pOne = (Map_Cut_t *)((ulong)pMVar11 ^ local_c0);
                    pMVar10->pTwo = (Map_Cut_t *)((ulong)pMVar12 ^ local_c8);
                    pMVar10->pNext =
                         (Map_Cut_t *)(&((timespec *)local_b8)->tv_sec)[pMVar10->nLeaves];
                    (&((timespec *)local_b8)->tv_sec)[pMVar10->nLeaves] = (__time_t)pMVar10;
                    iVar4 = iVar4 + 1;
                    if (iVar4 == 1000) goto LAB_003fd1f8;
                  }
                  lVar20 = lVar20 + 1;
                } while (local_e8 != lVar20);
                if (uVar21 != 0) {
                  uVar17 = 0;
                  do {
                    pMVar11 = local_e0[uVar17];
                    pMVar12 = local_138[uVar21];
                    iVar6 = p->nVarsMax;
                    if ((((iVar6 != pMVar11->nLeaves) || (iVar6 != pMVar12->nLeaves)) ||
                        ((pMVar11->ppLeaves[0] == pMVar12->ppLeaves[0] &&
                         (pMVar11->ppLeaves[1] == pMVar12->ppLeaves[1])))) &&
                       ((iVar6 = Map_CutMergeTwo(pMVar11,pMVar12,local_68,iVar6), iVar6 != 0 &&
                        (pMVar10 = Map_CutTableConsider(p,p_02,local_68,iVar6),
                        pMVar10 != (Map_Cut_t *)0x0)))) {
                      pMVar10->pOne = (Map_Cut_t *)((ulong)pMVar11 ^ local_c0);
                      pMVar10->pTwo = (Map_Cut_t *)((ulong)pMVar12 ^ local_c8);
                      pMVar10->pNext =
                           (Map_Cut_t *)(&((timespec *)local_b8)->tv_sec)[pMVar10->nLeaves];
                      (&((timespec *)local_b8)->tv_sec)[pMVar10->nLeaves] = (__time_t)pMVar10;
                      iVar4 = iVar4 + 1;
                      if (iVar4 == 1000) goto LAB_003fd1f8;
                    }
                    uVar17 = uVar17 + 1;
                  } while (uVar21 != uVar17);
                }
                uVar21 = uVar21 + 1;
                local_e8 = local_e8 + 1;
              } while (uVar21 != local_70);
            }
            if ((int)uVar24 < (int)local_10c) {
              if ((int)uVar19 < (int)uVar5) {
                uVar5 = uVar19;
              }
              lVar20 = (long)(int)uVar5;
              do {
                if (0 < (int)uVar24) {
                  uVar21 = 0;
                  do {
                    pMVar11 = local_e0[uVar21];
                    pMVar12 = local_138[lVar20];
                    iVar6 = p->nVarsMax;
                    if ((((iVar6 != pMVar11->nLeaves) || (iVar6 != pMVar12->nLeaves)) ||
                        ((pMVar11->ppLeaves[0] == pMVar12->ppLeaves[0] &&
                         (pMVar11->ppLeaves[1] == pMVar12->ppLeaves[1])))) &&
                       ((iVar6 = Map_CutMergeTwo(pMVar11,pMVar12,local_68,iVar6), iVar6 != 0 &&
                        (pMVar10 = Map_CutTableConsider(p,p_02,local_68,iVar6),
                        pMVar10 != (Map_Cut_t *)0x0)))) {
                      pMVar10->pOne = (Map_Cut_t *)((ulong)pMVar11 ^ (ulong)uVar7);
                      pMVar10->pTwo = (Map_Cut_t *)((ulong)pMVar12 ^ (ulong)local_108);
                      pMVar10->pNext =
                           (Map_Cut_t *)(&((timespec *)local_b8)->tv_sec)[pMVar10->nLeaves];
                      (&((timespec *)local_b8)->tv_sec)[pMVar10->nLeaves] = (__time_t)pMVar10;
                      iVar4 = iVar4 + 1;
                      if (iVar4 == 1000) goto LAB_003fd1f8;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar24 != uVar21);
                }
                lVar20 = lVar20 + 1;
              } while ((uVar5 - uVar24) + local_10c != (int)lVar20);
            }
LAB_003fd1f8:
            uVar21 = local_78;
            p_01 = local_80;
            local_d8 = (Map_Cut_t *)0x0;
            uVar7 = p->nVarsMax;
            puVar16 = (undefined1 *)&local_d8;
            if (0 < (int)uVar7) {
              lVar20 = 1;
              puVar16 = (undefined1 *)&local_d8;
              do {
                puVar2 = (undefined1 *)(&((timespec *)local_b8)->tv_sec)[lVar20];
                puVar3 = puVar2;
                if (puVar2 != (undefined1 *)0x0) {
                  do {
                    puVar22 = puVar3;
                    puVar3 = *(undefined1 **)puVar22;
                  } while (puVar3 != (undefined1 *)0x0);
                  *(undefined1 **)puVar16 = puVar2;
                  puVar16 = puVar22;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 != (ulong)uVar7 + 1);
            }
            *(undefined8 *)puVar16 = 0;
            pMVar11 = Map_CutSortCuts(p,p_02,local_d8);
            if (pMVar11 == (Map_Cut_t *)0x0) {
              __assert_fail("pList",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                            ,0xf2,
                            "Map_Cut_t *Map_CutCompute(Map_Man_t *, Map_CutTable_t *, Map_Node_t *)"
                           );
            }
            if (p_00->pRepr == (Map_Node_t *)0x0) {
              for (pMVar18 = p_00->pNextE; pMVar18 != (Map_Node_t *)0x0; pMVar18 = pMVar18->pNextE)
              {
                pMVar12 = pMVar18->pCuts;
                pMVar26 = pMVar11;
                pMVar10 = pMVar11;
                if (pMVar12 == (Map_Cut_t *)0x0) {
                  __assert_fail("pTemp->pCuts",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                                ,0xf8,
                                "Map_Cut_t *Map_CutCompute(Map_Man_t *, Map_CutTable_t *, Map_Node_t *)"
                               );
                }
                while (pMVar13 = pMVar26, pMVar13 != (Map_Cut_t *)0x0) {
                  pMVar10 = pMVar13;
                  pMVar26 = pMVar13->pNext;
                }
                if (pMVar10->pNext != (Map_Cut_t *)0x0) {
                  __assert_fail("pRoot->pNext == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                                ,0x2ba,"Map_Cut_t *Map_CutUnionLists(Map_Cut_t *, Map_Cut_t *)");
                }
                pMVar10->pNext = pMVar12->pNext;
                pMVar12->pNext = (Map_Cut_t *)0x0;
                pMVar11 = Map_CutSortCuts(p,p_02,pMVar11);
              }
            }
            pMVar12 = Map_CutAlloc(p);
            pMVar12->nLeaves = '\x01';
            pMVar12->ppLeaves[0] = p_00;
            pMVar12->uTruth = 0xaaaaaaaa;
            pMVar12->pNext = pMVar11;
            p_00->pCuts = pMVar12;
LAB_003fd2bf:
            pMVar26 = pMVar11;
            pMVar10 = pMVar12;
            if (pMVar26 != (Map_Cut_t *)0x0) {
              pMVar11 = pMVar26->pNext;
              pMVar13 = p_00->pCuts;
              do {
                pMVar13 = pMVar13->pNext;
                pMVar12 = pMVar26;
                if (pMVar13 == pMVar26) goto LAB_003fd2bf;
                uVar7 = (uint)pMVar13->nLeaves;
                if (pMVar13->nLeaves < '\x01') {
                  uVar17 = 0;
                }
                else {
                  uVar24 = (uint)pMVar26->nLeaves;
                  uVar17 = 0;
                  do {
                    if (pMVar26->nLeaves < '\x01') {
                      uVar23 = 0;
                    }
                    else {
                      uVar23 = 0;
                      do {
                        if (pMVar13->ppLeaves[uVar17] == pMVar26->ppLeaves[uVar23])
                        goto LAB_003fd320;
                        uVar23 = uVar23 + 1;
                      } while (uVar24 != uVar23);
                      uVar23 = (ulong)uVar24;
                    }
LAB_003fd320:
                    if ((uint)uVar23 == uVar24) goto LAB_003fd333;
                    uVar17 = uVar17 + 1;
                  } while (uVar17 != uVar7);
                  uVar17 = (ulong)uVar7;
                }
LAB_003fd333:
              } while ((uint)uVar17 != uVar7);
              pMVar10->pNext = pMVar26->pNext;
              Map_CutFree(p,pMVar26);
              pMVar12 = pMVar10;
              goto LAB_003fd2bf;
            }
            if ((p_00->pRepr != (Map_Node_t *)0x0) &&
               (iVar4 = Map_NodeComparePhase(p_00,p_00->pRepr), iVar4 != 0)) {
              for (pMVar11 = p_00->pCuts; pMVar11 != (Map_Cut_t *)0x0; pMVar11 = pMVar11->pNext) {
                pMVar11->Phase = '\x01';
              }
            }
          }
          goto LAB_003fcd3e;
        }
      }
      else {
        Map_MappingCutsInput(p,p_00);
LAB_003fcd3e:
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar15)) {
          Extra_ProgressBarUpdate_int(p_01,(int)lVar15,"Cuts ...");
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != uVar21);
  }
  Extra_ProgressBarStop(p_01);
  if (p_02->pCuts1 != (Map_Cut_t **)0x0) {
    free(p_02->pCuts1);
    p_02->pCuts1 = (Map_Cut_t **)0x0;
  }
  if (p_02->pCuts2 != (Map_Cut_t **)0x0) {
    free(p_02->pCuts2);
    p_02->pCuts2 = (Map_Cut_t **)0x0;
  }
  if (p_02->pArray != (Map_Cut_t **)0x0) {
    free(p_02->pArray);
    p_02->pArray = (Map_Cut_t **)0x0;
  }
  if (p_02->pBins != (Map_Cut_t **)0x0) {
    free(p_02->pBins);
    p_02->pBins = (Map_Cut_t **)0x0;
  }
  if (p_02->pCuts != (int *)0x0) {
    free(p_02->pCuts);
    p_02->pCuts = (int *)0x0;
  }
  free(p_02);
  if (p->fVerbose != 0) {
    uVar7 = Map_MappingCountAllCuts(p);
    iVar4 = 0x9a7d30;
    printf("Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ",
           SUB84((double)((float)(int)uVar7 / (float)p->nNodes),0),(ulong)(uint)p->nNodes,
           (ulong)(uint)p->nVarsMax,(ulong)uVar7);
    Abc_Print(iVar4,"%s =","Time");
    iVar6 = 3;
    iVar4 = clock_gettime(3,(timespec *)local_b8);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_b8[1] / 1000 + local_b8[0] * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",SUB84((double)(local_d0 + lVar15) / 1000000.0,0));
  }
  return;
}

Assistant:

void Map_MappingCuts( Map_Man_t * p )
{
    ProgressBar * pProgress;
    Map_CutTable_t * pTable;
    Map_Node_t * pNode;
    int nCuts, nNodes, i;
    abctime clk = Abc_Clock();
    // set the elementary cuts for the PI variables
    assert( p->nVarsMax > 1 && p->nVarsMax < 7 );
    for ( i = 0; i < p->nInputs; i++ )
        Map_MappingCutsInput( p, p->pInputs[i] );

    // compute the cuts for the internal nodes
    nNodes = p->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    pTable = Map_CutTableStart( p );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
        if ( Map_NodeIsBuf(pNode) )
            Map_MappingCutsInput( p, pNode );
        else if ( Map_NodeIsAnd(pNode) )
            Map_CutCompute( p, pTable, pNode );
        else continue;
        Extra_ProgressBarUpdate( pProgress, i, "Cuts ..." );
    }
    Extra_ProgressBarStop( pProgress );
    Map_CutTableStop( pTable );

    // report the stats
    if ( p->fVerbose )
    {
        nCuts = Map_MappingCountAllCuts(p);
        printf( "Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ", 
               p->nNodes, p->nVarsMax, nCuts, ((float)nCuts)/p->nNodes );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // print the cuts for the first primary output
//    Map_CutListPrint( p, Map_Regular(p->pOutputs[0]) );
}